

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_c92d48::HandleCopyFile
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  CopyResult CVar3;
  int iVar4;
  string *psVar5;
  char *pcVar6;
  string *this;
  string_view name;
  string_view name_00;
  string_view value;
  string_view value_00;
  string_view value_01;
  size_t sVar7;
  string err;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  string newname;
  string oldname;
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  undefined1 local_b8 [24];
  _Any_data _Stack_a0;
  _Manager_type p_Stack_90;
  _Invoker_type local_88;
  undefined1 auStack_80 [8];
  _Function_base local_78;
  pointer ppStack_60;
  pointer local_58;
  pointer ppStack_50;
  string local_40;
  
  this = &err;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,"COPY_FILE must be called with at least two additional arguments",
               (allocator<char> *)local_178._M_pod_data);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)local_b8);
    return false;
  }
  std::__cxx11::string::string((string *)&oldname,(string *)(pbVar1 + 1));
  bVar2 = cmsys::SystemTools::FileIsFullPath(&oldname);
  if (!bVar2) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    local_b8._8_8_ = (psVar5->_M_dataplus)._M_p;
    local_b8._0_8_ = psVar5->_M_string_length;
    local_178._8_8_ = &local_168;
    local_178._M_unused._0_8_ = (undefined8)&DAT_00000001;
    local_168 = (code *)CONCAT71(local_168._1_7_,0x2f);
    cmStrCat<std::__cxx11::string>
              ((string *)&arguments,(cmAlphaNum *)local_b8,(cmAlphaNum *)&local_178,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::operator=((string *)&oldname,(string *)&arguments);
    std::__cxx11::string::~string((string *)&arguments);
  }
  std::__cxx11::string::string
            ((string *)&newname,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  bVar2 = cmsys::SystemTools::FileIsFullPath(&newname);
  if (!bVar2) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    local_b8._8_8_ = (psVar5->_M_dataplus)._M_p;
    local_b8._0_8_ = psVar5->_M_string_length;
    local_178._8_8_ = &local_168;
    local_178._M_unused._0_8_ = (undefined8)&DAT_00000001;
    local_168 = (code *)CONCAT71(local_168._1_7_,0x2f);
    cmStrCat<std::__cxx11::string>
              ((string *)&arguments,(cmAlphaNum *)local_b8,(cmAlphaNum *)&local_178,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2);
    std::__cxx11::string::operator=((string *)&newname,(string *)&arguments);
    std::__cxx11::string::~string((string *)&arguments);
  }
  if (((anonymous_namespace)::
       HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_58 = (pointer)0x0;
    ppStack_50 = (pointer)0x0;
    local_78._M_manager = (_Manager_type)0x0;
    ppStack_60 = (pointer)0x0;
    local_78._M_functor._0_8_ = 0;
    local_78._M_functor._8_8_ = 0;
    local_88 = (_Invoker_type)0x0;
    auStack_80 = (undefined1  [8])0x0;
    _Stack_a0._8_8_ = 0;
    p_Stack_90 = (_Manager_type)0x0;
    local_b8._16_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    _Stack_a0._M_unused._M_object = (void *)0x0;
    local_b8._0_8_ = (ActionMap *)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_178._M_unused._M_object = (void *)0x0;
    local_178._8_8_ = 0;
    local_160 = std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                ::_M_invoke;
    local_168 = std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                ::_M_manager;
    name._M_str = "ONLY_IF_DIFFERENT";
    name._M_len = 0x11;
    ArgumentParser::Base::Bind((Base *)local_b8,name,(KeywordAction *)&local_178);
    std::_Function_base::~_Function_base((_Function_base *)&local_178);
    local_178._8_8_ = 0;
    local_178._M_unused._M_member_pointer = 8;
    local_160 = std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                ::_M_invoke;
    local_168 = std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                ::_M_manager;
    name_00._M_str = "RESULT";
    name_00._M_len = 6;
    ArgumentParser::Base::Bind((Base *)local_b8,name_00,(KeywordAction *)&local_178);
    std::_Function_base::~_Function_base((_Function_base *)&local_178);
    ArgumentParser::ActionMap::ActionMap((ActionMap *)&HandleCopyFile::parser,(ActionMap *)local_b8)
    ;
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)local_b8);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleCopyFile::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_b8._16_8_ = &unconsumedArgs;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_178._M_unused._M_object =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 3;
  psVar5 = &arguments.Result;
  arguments.OnlyIfDifferent = false;
  arguments.Result._M_dataplus._M_p = (pointer)&arguments.Result.field_2;
  arguments.Result._M_string_length = 0;
  arguments.Result.field_2._M_local_buf[0] = '\0';
  local_b8._0_8_ = &HandleCopyFile::parser;
  local_b8._8_8_ = (pointer)0x0;
  _Stack_a0._M_unused._M_object = &arguments;
  _Stack_a0._8_8_ = 0;
  p_Stack_90 = (_Manager_type)0x0;
  local_88 = (_Invoker_type)0x0;
  auStack_80 = (undefined1  [8])0x0;
  local_78._M_functor._0_8_ = 0;
  local_78._M_functor._8_8_ = 0;
  local_78._M_manager = (_Manager_type)0x0;
  ppStack_60 = (pointer)0x0;
  local_58 = (pointer)((ulong)local_58 & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_b8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_178,0);
  std::_Function_base::~_Function_base(&local_78);
  if (unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = cmsys::SystemTools::FileIsDirectory(&oldname);
    if (bVar2) {
      if (arguments.Result._M_string_length != 0) {
        pcVar6 = "cannot copy a directory";
        sVar7 = 0x17;
LAB_002da2da:
        bVar2 = true;
        value._M_str = pcVar6;
        value._M_len = sVar7;
        cmMakefile::AddDefinition(status->Makefile,psVar5,value);
        goto LAB_002da253;
      }
      local_b8._0_8_ = (ActionMap *)0x24;
      local_b8._8_8_ = "COPY_FILE cannot copy a directory\n  ";
      local_178._M_unused._M_member_pointer = oldname._M_string_length;
      local_178._8_8_ = oldname._M_dataplus._M_p;
      cmStrCat<>(&err,(cmAlphaNum *)local_b8,(cmAlphaNum *)&local_178);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      this = &err;
    }
    else {
      bVar2 = cmsys::SystemTools::FileIsDirectory(&newname);
      if (!bVar2) {
        err._M_dataplus._M_p = (pointer)&err.field_2;
        err._M_string_length = 0;
        err.field_2._M_local_buf[0] = '\0';
        CVar3 = cmSystemTools::CopySingleFile
                          (&oldname,&newname,(uint)arguments.OnlyIfDifferent,&err);
        if (CVar3 == Success) {
          bVar2 = true;
          if (arguments.Result._M_string_length != 0) {
            value_01._M_str = "0";
            value_01._M_len = 1;
            cmMakefile::AddDefinition(status->Makefile,psVar5,value_01);
          }
        }
        else if (arguments.Result._M_string_length == 0) {
          local_b8._0_8_ = &DAT_0000001b;
          local_b8._8_8_ = "COPY_FILE failed to copy\n  ";
          local_178._M_unused._M_member_pointer = oldname._M_string_length;
          local_178._8_8_ = oldname._M_dataplus._M_p;
          cmStrCat<char[7],std::__cxx11::string,char[11],std::__cxx11::string,char[2]>
                    (&local_40,(cmAlphaNum *)local_b8,(cmAlphaNum *)&local_178,
                     (char (*) [7])"\nto\n  ",&newname,(char (*) [11])"\nbecause: ",&err,
                     (char (*) [2])0x64a205);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&local_40);
          bVar2 = false;
        }
        else {
          bVar2 = true;
          value_00._M_str = err._M_dataplus._M_p;
          value_00._M_len = err._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,psVar5,value_00);
        }
        std::__cxx11::string::~string((string *)&err);
        goto LAB_002da253;
      }
      if (arguments.Result._M_string_length != 0) {
        pcVar6 = "cannot copy to a directory";
        sVar7 = 0x1a;
        goto LAB_002da2da;
      }
      local_b8._0_8_ = (ActionMap *)0x27;
      local_b8._8_8_ = "COPY_FILE cannot copy to a directory\n  ";
      local_178._M_unused._M_member_pointer = newname._M_string_length;
      local_178._8_8_ = newname._M_dataplus._M_p;
      cmStrCat<>(&err,(cmAlphaNum *)local_b8,(cmAlphaNum *)&local_178);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   "COPY_FILE unknown argument:\n  ",
                   unconsumedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this = (string *)local_b8;
  }
  std::__cxx11::string::~string((string *)this);
  bVar2 = false;
LAB_002da253:
  std::__cxx11::string::~string((string *)psVar5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unconsumedArgs);
  std::__cxx11::string::~string((string *)&newname);
  std::__cxx11::string::~string((string *)&oldname);
  return bVar2;
}

Assistant:

bool HandleCopyFile(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("COPY_FILE must be called with at least two additional "
                    "arguments");
    return false;
  }

  // Compute full path for old and new names.
  std::string oldname = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(oldname)) {
    oldname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }
  std::string newname = args[2];
  if (!cmsys::SystemTools::FileIsFullPath(newname)) {
    newname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[2]);
  }

  struct Arguments
  {
    bool OnlyIfDifferent = false;
    std::string Result;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("ONLY_IF_DIFFERENT"_s, &Arguments::OnlyIfDifferent)
      .Bind("RESULT"_s, &Arguments::Result);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);
  if (!unconsumedArgs.empty()) {
    status.SetError("COPY_FILE unknown argument:\n  " +
                    unconsumedArgs.front());
    return false;
  }

  bool result = true;
  if (cmsys::SystemTools::FileIsDirectory(oldname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy a directory\n  ", oldname));
      result = false;
    }
    return result;
  }
  if (cmsys::SystemTools::FileIsDirectory(newname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy to a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy to a directory\n  ", newname));
      result = false;
    }
    return result;
  }

  cmSystemTools::CopyWhen when;
  if (arguments.OnlyIfDifferent) {
    when = cmSystemTools::CopyWhen::OnlyIfDifferent;
  } else {
    when = cmSystemTools::CopyWhen::Always;
  }

  std::string err;
  if (cmSystemTools::CopySingleFile(oldname, newname, when, &err) ==
      cmSystemTools::CopyResult::Success) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, "0");
    }
  } else {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, err);
    } else {
      status.SetError(cmStrCat("COPY_FILE failed to copy\n  ", oldname,
                               "\nto\n  ", newname, "\nbecause: ", err, "\n"));
      result = false;
    }
  }

  return result;
}